

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void __thiscall
immutable::ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
          (ref<immutable::rrb_details::tree_node<int,_true>_> *this)

{
  ref<immutable::rrb_details::tree_node<int,_true>_> *this_local;
  
  rrb_details::release<int>(this->ptr);
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }